

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack,qsizetype from,QByteArrayView needle)

{
  long lVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  size_t __n;
  size_t sVar6;
  long lVar7;
  storage_type *__s;
  ulong uVar8;
  byte *__s1;
  
  __s = haystack.m_data;
  lVar3 = haystack.m_size;
  __s1 = (byte *)needle.m_data;
  __n = needle.m_size;
  if (lVar3 == 0) {
    uVar8 = -(ulong)(__n != 0 || from != 0);
  }
  else if (__n == 1) {
    if (from < 0) {
      lVar7 = 0;
      if (0 < from + lVar3) {
        lVar7 = from + lVar3;
      }
    }
    else {
      lVar7 = lVar3 + -1;
      if (from <= lVar3 + -1) {
        lVar7 = from;
      }
    }
    if (__s == (storage_type *)0x0) {
      pvVar4 = (void *)0x0;
    }
    else {
      pvVar4 = memrchr(__s,(uint)*__s1,lVar7 + 1);
    }
    uVar8 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)__s;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    if (from <= lVar3) {
      lVar3 = lVar3 - __n;
      lVar7 = from;
      if (lVar3 < from) {
        lVar7 = lVar3;
      }
      if (from < 0) {
        lVar7 = lVar3;
      }
      if (-1 < lVar7) {
        if ((long)__n < 1) {
          lVar3 = 0;
          lVar5 = 0;
        }
        else {
          lVar5 = 0;
          lVar3 = 0;
          sVar6 = __n;
          do {
            lVar3 = (long)(char)__s1[sVar6 - 1] + lVar3 * 2;
            lVar5 = (long)__s[sVar6 + lVar7 + -1] + lVar5 * 2;
            sVar6 = sVar6 - 1;
          } while (sVar6 != 0);
        }
        lVar5 = lVar5 - __s[lVar7];
        do {
          lVar5 = __s[lVar7] + lVar5;
          if ((lVar5 == lVar3) && (iVar2 = bcmp(__s1,__s + lVar7,__n), iVar2 == 0)) {
            return lVar7;
          }
          if (__n - 1 < 0x40) {
            lVar5 = lVar5 - ((long)__s[lVar7 + (__n - 1)] << ((byte)(__n - 1) & 0x3f));
          }
          lVar5 = lVar5 * 2;
          lVar1 = lVar7 + -1;
          lVar7 = lVar7 + -1;
        } while (__s <= __s + lVar1);
        uVar8 = 0xffffffffffffffff;
      }
    }
  }
  return uVar8;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack, qsizetype from, QByteArrayView needle) noexcept
{
    if (haystack.isEmpty()) {
        if (needle.isEmpty() && from == 0)
            return 0;
        return -1;
    }
    const auto ol = needle.size();
    if (ol == 1)
        return QtPrivate::lastIndexOf(haystack, from, needle.front());

    return lastIndexOfHelper(haystack.data(), haystack.size(), needle.data(), ol, from);
}